

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void luaC_changemode(lua_State *L,int newmode)

{
  global_State *g_00;
  global_State *g;
  int newmode_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  if (newmode != (uint)g_00->gckind) {
    if (newmode == 1) {
      entergen(L,g_00);
    }
    else {
      enterinc(g_00);
    }
  }
  g_00->lastatomic = 0;
  return;
}

Assistant:

void luaC_changemode (lua_State *L, int newmode) {
  global_State *g = G(L);
  if (newmode != g->gckind) {
    if (newmode == KGC_GEN)  /* entering generational mode? */
      entergen(L, g);
    else
      enterinc(g);  /* entering incremental mode */
  }
  g->lastatomic = 0;
}